

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.cpp
# Opt level: O2

int __thiscall
duckdb::DecimalToString::DecimalLength<duckdb::hugeint_t>
          (DecimalToString *this,hugeint_t value,uint8_t width,uint8_t scale)

{
  int iVar1;
  uint uVar2;
  int64_t iVar3;
  int64_t extraout_RDX;
  uint uVar4;
  bool bVar5;
  hugeint_t value_00;
  hugeint_t value_01;
  hugeint_t value_local;
  
  iVar3 = value.upper;
  value_local.upper = value.lower;
  bVar5 = value_local.upper < 0;
  value_local.lower = (uint64_t)this;
  if (bVar5) {
    Hugeint::NegateInPlace<true>(&value_local);
    iVar3 = extraout_RDX;
  }
  if (width == '\0') {
    value_01.upper = iVar3;
    value_01.lower = value_local.upper;
    uVar2 = NumericHelper::UnsignedLength<duckdb::hugeint_t>
                      ((NumericHelper *)value_local.lower,value_01);
  }
  else {
    uVar4 = width + 1 + (uint)(width < (byte)value.upper);
    value_00.upper = iVar3;
    value_00.lower = value_local.upper;
    iVar1 = NumericHelper::UnsignedLength<duckdb::hugeint_t>
                      ((NumericHelper *)value_local.lower,value_00);
    uVar2 = iVar1 + 1U;
    if (iVar1 + 1U < uVar4) {
      uVar2 = uVar4;
    }
  }
  return uVar2 + bVar5;
}

Assistant:

int DecimalToString::DecimalLength(hugeint_t value, uint8_t width, uint8_t scale) {
	D_ASSERT(value > NumericLimits<hugeint_t>::Minimum());
	int negative;

	if (value.upper < 0) {
		Hugeint::NegateInPlace(value);
		negative = 1;
	} else {
		negative = 0;
	}
	if (scale == 0) {
		// scale is 0: regular number
		return NumericHelper::UnsignedLength(value) + negative;
	}
	// length is max of either:
	// scale + 2 OR
	// integer length + 1
	// scale + 2 happens when the number is in the range of (-1, 1)
	// in that case we print "0.XXX", which is the scale, plus "0." (2 chars)
	// integer length + 1 happens when the number is outside of that range
	// in that case we print the integer number, but with one extra character ('.')
	auto extra_numbers = width > scale ? 2 : 1;
	return MaxValue(scale + extra_numbers, NumericHelper::UnsignedLength(value) + 1) + negative;
}